

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O1

void deqp::egl::anon_unknown_0::addTestGroups
               (EglTestContext *eglTestCtx,TestCaseGroup *group,NativeType type)

{
  SimpleConfigCase *pSVar1;
  long *plVar2;
  long *plVar3;
  pointer filters;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  FilterList baseFilters;
  allocator<char> local_b9;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98 [2];
  long local_88 [2];
  TestCaseGroup *local_78;
  EglTestContext *local_70;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> local_68;
  FilterList local_48;
  
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = group;
  local_70 = eglTestCtx;
  eglu::FilterList::operator<<(&local_48,(ConfigFilter)(&PTR_surfaceType<4u>_02156798)[(int)type]);
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_68,&local_48);
  if (local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    filters = local_68.
              super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar1 = (SimpleConfigCase *)operator_new(0xc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,(filters->m_name)._M_dataplus._M_p,&local_b9);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_98);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_a8 = *plVar3;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar3;
        local_b8 = (long *)*plVar2;
      }
      local_b0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      SimpleConfigCase::SimpleConfigCase
                (pSVar1,local_70,(char *)local_b8,(filters->m_description)._M_dataplus._M_p,
                 &filters->super_FilterList);
      (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__NativeCoordMappingCase_02156750;
      *(NativeType *)&pSVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = type;
      *(undefined1 *)
       ((long)&pSVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
      tcu::TestNode::addChild((TestNode *)local_78,(TestNode *)pSVar1);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      pSVar1 = (SimpleConfigCase *)operator_new(0xc0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,(filters->m_name)._M_dataplus._M_p,&local_b9);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_98);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_a8 = *plVar3;
        lStack_a0 = plVar2[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar3;
        local_b8 = (long *)*plVar2;
      }
      local_b0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      SimpleConfigCase::SimpleConfigCase
                (pSVar1,local_70,(char *)local_b8,(filters->m_description)._M_dataplus._M_p,
                 &filters->super_FilterList);
      (pSVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__NativeCoordMappingCase_02156750;
      *(NativeType *)&pSVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = type;
      *(undefined1 *)
       ((long)&pSVar1[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = 1;
      tcu::TestNode::addChild((TestNode *)local_78,(TestNode *)pSVar1);
      if (local_b8 != &local_a8) {
        operator_delete(local_b8,local_a8 + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      filters = filters + 1;
    } while (filters !=
             local_68.
             super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_68);
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addTestGroups (EglTestContext& eglTestCtx, TestCaseGroup* group, NativeCoordMappingCase::NativeType type)
{
	eglu::FilterList baseFilters;

	switch (type)
	{
		case NativeCoordMappingCase::NATIVETYPE_WINDOW:
			baseFilters << surfaceType<EGL_WINDOW_BIT>;
			break;

		case NativeCoordMappingCase::NATIVETYPE_PIXMAP:
			baseFilters << surfaceType<EGL_PIXMAP_BIT>;
			break;

		case NativeCoordMappingCase::NATIVETYPE_PBUFFER_COPY_TO_PIXMAP:
			baseFilters << surfaceType<EGL_PBUFFER_BIT>;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	vector<NamedFilterList> filterLists;
	getDefaultFilterLists(filterLists, baseFilters);

	for (vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
	{
		group->addChild(new NativeCoordMappingCase(eglTestCtx, (string(i->getName()) + "_clear").c_str(), i->getDescription(), false, type, *i));
		group->addChild(new NativeCoordMappingCase(eglTestCtx, (string(i->getName()) + "_render").c_str(), i->getDescription(), true, type, *i));
	}
}